

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_spectrum.cpp
# Opt level: O2

Spectrum *
window_standards::create_spectrum
          (Spectrum *__return_storage_ptr__,string *line,string *standard_directory)

{
  string *this;
  double dVar1;
  char *pcVar2;
  bool bVar3;
  size_type sVar4;
  long lVar5;
  Spectrum_Type SVar6;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  string spectum_path;
  string a;
  string b;
  regex pattern;
  
  (__return_storage_ptr__->description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->description).field_2;
  (__return_storage_ptr__->description)._M_string_length = 0;
  this = &__return_storage_ptr__->description;
  (__return_storage_ptr__->description).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->t = NAN;
  __return_storage_ptr__->a = NAN;
  __return_storage_ptr__->b = NAN;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = "TestCreateSpectrum_None";
  SVar6 = NONE;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"None",0);
  if (sVar4 != 0xffffffffffffffff) {
LAB_0012ca94:
    __return_storage_ptr__->type = SVar6;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (this,pcVar2 + 0x13);
    return __return_storage_ptr__;
  }
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"Blackbody",0);
  if ((sVar4 == 0xffffffffffffffff) ||
     (sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (line,".SSP",0), sVar4 != 0xffffffffffffffff)) {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (line,"UV Action",0);
    if ((sVar4 == 0xffffffffffffffff) ||
       (sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(line,".SSP",0), sVar4 != 0xffffffffffffffff)) {
      pcVar2 = "TestCreateSpectrum_Krochmann";
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (line,"Krochmann",0);
      if ((sVar4 == 0xffffffffffffffff) ||
         (sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(line,".SSP",0), sVar4 != 0xffffffffffffffff)) {
        std::__cxx11::string::string((string *)&spectum_path,standard_directory);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&spectum_path,line);
        load_spectrum((Spectrum *)&pattern,&spectum_path);
        Spectrum::operator=(__return_storage_ptr__,(Spectrum *)&pattern);
        Spectrum::~Spectrum((Spectrum *)&pattern);
        std::__cxx11::string::~string((string *)&spectum_path);
        return __return_storage_ptr__;
      }
      SVar6 = KROCHMANN;
      goto LAB_0012ca94;
    }
    __return_storage_ptr__->type = UV_ACTION;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (this,"UV Action");
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern,".*a=(.*), b=(.*)\\)",0x10);
    spectum_path.field_2._M_allocated_capacity = 0;
    spectum_path.field_2._8_8_ = 0;
    spectum_path._M_dataplus._M_p = (pointer)0x0;
    spectum_path._M_string_length = 0;
    bVar3 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&spectum_path,&pattern,0);
    if (!bVar3) goto LAB_0012cd3b;
    lVar5 = spectum_path._M_string_length - (long)spectum_path._M_dataplus._M_p;
    if ((lVar5 == 0) || (0xfffffffffffffffd < lVar5 / 0x18 - 5U)) {
      psVar7 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(spectum_path._M_dataplus._M_p + lVar5 + -0x48);
    }
    else {
      psVar7 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(spectum_path._M_dataplus._M_p + 0x18);
    }
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&a,psVar7);
    lVar5 = spectum_path._M_string_length - (long)spectum_path._M_dataplus._M_p;
    if ((lVar5 == 0) || (0xfffffffffffffffc < lVar5 / 0x18 - 6U)) {
      psVar7 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(spectum_path._M_dataplus._M_p + lVar5 + -0x48);
    }
    else {
      psVar7 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(spectum_path._M_dataplus._M_p + 0x30);
    }
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&b,psVar7);
    dVar1 = std::__cxx11::stod(&a,(size_t *)0x0);
    __return_storage_ptr__->a = dVar1;
    dVar1 = std::__cxx11::stod(&b,(size_t *)0x0);
    __return_storage_ptr__->b = dVar1;
    std::__cxx11::string::~string((string *)&b);
  }
  else {
    __return_storage_ptr__->type = BLACKBODY;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (this,"Blackbody");
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern,".*T=(.*)K\\)",0x10);
    spectum_path.field_2._M_allocated_capacity = 0;
    spectum_path.field_2._8_8_ = 0;
    spectum_path._M_dataplus._M_p = (pointer)0x0;
    spectum_path._M_string_length = 0;
    bVar3 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&spectum_path,&pattern,0);
    if (!bVar3) goto LAB_0012cd3b;
    lVar5 = spectum_path._M_string_length - (long)spectum_path._M_dataplus._M_p;
    if ((lVar5 == 0) || (0xfffffffffffffffd < lVar5 / 0x18 - 5U)) {
      psVar7 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(spectum_path._M_dataplus._M_p + lVar5 + -0x48);
    }
    else {
      psVar7 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(spectum_path._M_dataplus._M_p + 0x18);
    }
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&a,psVar7);
    dVar1 = std::__cxx11::stod(&a,(size_t *)0x0);
    __return_storage_ptr__->t = dVar1;
  }
  std::__cxx11::string::~string((string *)&a);
LAB_0012cd3b:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&spectum_path);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return __return_storage_ptr__;
}

Assistant:

Spectrum create_spectrum(std::string const & line, std::string const & standard_directory)
    {
        Spectrum spectrum;

        if(line.find("None") != std::string::npos)
        {
            spectrum.type = Spectrum_Type::NONE;
            spectrum.description = "None";
        }
        else if(line.find("Blackbody") != std::string::npos && line.find(".SSP") == std::string::npos)
        {
            spectrum.type = Spectrum_Type::BLACKBODY;
            spectrum.description = "Blackbody";

            std::regex pattern(".*T=(.*)K\\)");
            // auto itr = std::sregex_iterator(line.begin(), line.end(), pattern);
            // std::string val = itr->str();
            std::smatch matches;
            if(std::regex_search(line, matches, pattern))
            {
                std::string val = matches[1].str();
                spectrum.t = std::stod(val);
            }
        }
        else if(line.find("UV Action") != std::string::npos && line.find(".SSP") == std::string::npos)
        {
            spectrum.type = Spectrum_Type::UV_ACTION;
            spectrum.description = "UV Action";
            std::regex pattern(".*a=(.*), b=(.*)\\)");
            // auto itr = std::sregex_iterator(line.begin(), line.end(), pattern);
            // std::string a = itr->str(1);
            // std::string a = itr->str(2);
            std::smatch matches;
            if(std::regex_search(line, matches, pattern))
            {
                std::string a = matches[1].str();
                std::string b = matches[2].str();
                spectrum.a = std::stod(a);
                spectrum.b = std::stod(b);
            }
        }
        else if((line.find("Krochmann") != std::string::npos) && (line.find(".SSP") == std::string::npos))
        {
            spectrum.type = Spectrum_Type::KROCHMANN;
            spectrum.description = "Krochmann";
        }
        else
        {
            std::string spectum_path = standard_directory;
            spectum_path += line;
            spectrum = load_spectrum(spectum_path);
        }

        return spectrum;
    }